

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets,uchar *head,size_t size
              ,string *err)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int x_stride;
  int height;
  int iVar4;
  pointer puVar5;
  pointer puVar6;
  EXRChannelInfo *pEVar7;
  long lVar8;
  EXRAttribute *attributes;
  int width;
  int num_lines;
  bool bVar9;
  int c;
  int iVar10;
  EXRTile *pEVar11;
  uchar **ppuVar12;
  ostream *poVar13;
  unsigned_long uVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int *piVar21;
  size_t __size;
  size_t sVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  size_t y_idx;
  bool bVar27;
  undefined4 in_stack_fffffffffffffd80;
  int num_channels;
  string local_230 [32];
  int local_210;
  int local_20c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  stringstream ss;
  ostream local_1a8 [376];
  
  iVar1 = exr_header->compression_type;
  iVar10 = 0x10;
  if ((iVar1 != 3) && (iVar1 != 0x80)) {
    if (iVar1 == 4) {
      iVar10 = 0x20;
    }
    else {
      iVar10 = 1;
    }
  }
  iVar1 = (exr_header->data_window).max_x;
  iVar2 = (exr_header->data_window).min_x;
  iVar15 = iVar1 - iVar2;
  if ((iVar1 < iVar2) ||
     (iVar1 = (exr_header->data_window).max_y, iVar2 = (exr_header->data_window).min_y,
     iVar26 = iVar1 - iVar2, iVar1 < iVar2)) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (err,"Invalid data window.\n");
    return -4;
  }
  iVar1 = iVar15 + 1;
  iVar2 = iVar26 + 1;
  if (0x7fffff < iVar15 || 0x7fffff < iVar26) {
    if (err == (string *)0x0) {
      return -4;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar13 = std::operator<<(local_1a8,"data_with or data_height too large. data_width: ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar1);
    poVar13 = std::operator<<(poVar13,", ");
    poVar13 = std::operator<<(poVar13,"data_height = ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar2);
    std::endl<char,std::char_traits<char>>(poVar13);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::~string(local_230);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return -4;
  }
  num_channels = exr_header->num_channels;
  puVar5 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = (ulong)num_channels;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar7 = exr_header->channels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&channel_offset_list,uVar16);
  uVar24 = (ulong)((long)puVar5 - (long)puVar6) >> 3;
  piVar21 = &pEVar7->pixel_type;
  uVar14 = 0;
  iVar23 = 0;
  for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
    channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] = uVar14;
    uVar18 = (ulong)(uint)*piVar21;
    if (2 < uVar18) {
      if (uVar17 < uVar16) {
        iVar10 = -4;
        if ((EXRChannelInfo *)err != (EXRChannelInfo *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (err,"Failed to compute channel layout.\n");
        }
        goto LAB_0016267b;
      }
      break;
    }
    iVar23 = iVar23 + *(int *)(&DAT_00278940 + uVar18 * 4);
    uVar14 = uVar14 + *(long *)(&DAT_00278950 + uVar18 * 8);
    piVar21 = piVar21 + 0x44;
  }
  if (exr_header->tiled == 0) {
    if ((long)iVar1 * uVar16 * (long)iVar2 - 0x4000000000 < 0xffffffc000000001) {
      iVar10 = -4;
      if ((EXRChannelInfo *)err == (EXRChannelInfo *)0x0) goto LAB_0016267b;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar13 = std::operator<<(local_1a8,"Image data size is zero or too large: width = ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar1);
      poVar13 = std::operator<<(poVar13,", height = ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar2);
      poVar13 = std::operator<<(poVar13,", channels = ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,num_channels);
      std::endl<char,std::char_traits<char>>(poVar13);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)err);
      goto LAB_001625cb;
    }
    ppuVar12 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                             iVar1,iVar2);
    exr_image->images = ppuVar12;
    uVar17 = 0;
    uVar16 = uVar24 & 0xffffffff;
    if ((int)uVar24 < 1) {
      uVar16 = uVar17;
    }
    bVar27 = false;
    for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
      uVar14 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      bVar9 = true;
      if (uVar14 + 8 <= size) {
        iVar15 = *(int *)(head + uVar14 + 4);
        if ((ulong)(long)iVar15 <= size - (uVar14 + 8)) {
          iVar26 = *(int *)(head + uVar14);
          if (iVar15 != 0 && 0xffbffffe < iVar26 - 0x200001U) {
            iVar20 = (exr_header->data_window).max_y + 1;
            if (iVar26 + iVar10 <= iVar20) {
              iVar20 = iVar26 + iVar10;
            }
            if (((iVar20 - iVar26 != 0 && iVar26 <= iVar20) &&
                (iVar19 = (exr_header->data_window).min_y,
                0xffffffff00000000 < ((long)iVar26 - (long)iVar19) - 0x80000000U)) &&
               (iVar19 = iVar26 - iVar19, -1 < iVar19)) {
              bVar9 = DecodePixelData(exr_image->images,exr_header->requested_pixel_types,
                                      head + uVar14 + 8,(long)iVar15,exr_header->compression_type,
                                      exr_header->line_order,iVar1,iVar2,iVar1,(int)uVar17,iVar19,
                                      iVar20 - iVar26,(long)iVar23,(long)exr_header->num_channels,
                                      (EXRAttribute *)exr_header->channels,
                                      (size_t)&channel_offset_list,(EXRChannelInfo *)err,
                                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      CONCAT44(num_channels,in_stack_fffffffffffffd80));
              bVar9 = (bool)(!bVar9 | bVar27);
            }
          }
        }
      }
      bVar27 = bVar9;
    }
    if (!bVar27) goto LAB_0016261d;
    iVar10 = -4;
    if ((EXRChannelInfo *)err == (EXRChannelInfo *)0x0) goto LAB_0016267b;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (err,"Invalid data found when decoding pixels.\n");
  }
  else {
    if (exr_header->tile_size_x < 0) {
      iVar10 = -9;
      if ((EXRChannelInfo *)err == (EXRChannelInfo *)0x0) goto LAB_0016267b;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar13 = std::operator<<(local_1a8,"Invalid tile size x : ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,exr_header->tile_size_x);
      std::operator<<(poVar13,"\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)err);
    }
    else {
      if (-1 < exr_header->tile_size_y) {
        __size = (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        pEVar11 = (EXRTile *)calloc(0x20,__size);
        exr_image->tiles = pEVar11;
        lVar25 = 0;
        iVar20 = -4;
        iVar10 = 0;
        sVar22 = __size;
        while (bVar27 = sVar22 != 0, sVar22 = sVar22 - 1, bVar27) {
          ppuVar12 = AllocateImage(num_channels,exr_header->channels,
                                   exr_header->requested_pixel_types,exr_header->tile_size_x,
                                   exr_header->tile_size_y);
          pEVar11 = exr_image->tiles;
          *(uchar ***)((long)&pEVar11->images + lVar25 * 4) = ppuVar12;
          lVar8 = *(long *)((long)(offsets->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start + lVar25);
          if (size < lVar8 + 0x14U) {
            iVar10 = -4;
            if ((EXRChannelInfo *)err != (EXRChannelInfo *)0x0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(err,"Insufficient data size.\n");
            }
            goto LAB_0016267b;
          }
          if (*(int *)(head + lVar8 + 0xc) != 0 || *(int *)(head + lVar8 + 8) != 0) {
            iVar10 = -10;
            goto LAB_0016267b;
          }
          uVar16 = (ulong)*(int *)(head + lVar8 + 0x10);
          if (((long)uVar16 < 4) || (size - (lVar8 + 0x14U) < uVar16)) {
            iVar10 = -4;
            if ((EXRChannelInfo *)err != (EXRChannelInfo *)0x0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(err,"Insufficient data length.\n");
            }
            goto LAB_0016267b;
          }
          iVar19 = *(int *)(head + lVar8);
          iVar3 = *(int *)(head + lVar8 + 4);
          x_stride = exr_header->tile_size_x;
          if (((iVar1 < x_stride) || (height = exr_header->tile_size_y, iVar2 < height)) ||
             ((iVar1 < x_stride * iVar19 || (iVar2 < height * iVar3)))) {
            iVar10 = iVar20;
            if ((EXRChannelInfo *)err != (EXRChannelInfo *)0x0) goto LAB_00162162;
          }
          else {
            piVar21 = exr_header->requested_pixel_types;
            local_20c = exr_header->compression_type;
            local_210 = exr_header->line_order;
            iVar4 = exr_header->num_channels;
            width = iVar1 - x_stride * iVar19;
            if ((iVar19 + 1) * x_stride <= iVar15) {
              width = x_stride;
            }
            attributes = (EXRAttribute *)exr_header->channels;
            (&pEVar11->width)[lVar25] = width;
            num_lines = iVar2 - height * iVar3;
            if ((iVar3 + 1) * height <= iVar26) {
              num_lines = height;
            }
            (&pEVar11->height)[lVar25] = num_lines;
            bVar27 = DecodePixelData(ppuVar12,piVar21,head + lVar8 + 0x14,uVar16,local_20c,local_210
                                     ,width,height,x_stride,0,0,num_lines,(long)iVar23,(long)iVar4,
                                     attributes,(size_t)&channel_offset_list,(EXRChannelInfo *)err,
                                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     CONCAT44(num_channels,in_stack_fffffffffffffd80));
            if (!bVar27) {
              iVar10 = iVar20;
            }
            if ((EXRChannelInfo *)err != (EXRChannelInfo *)0x0 && !bVar27) {
LAB_00162162:
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(err,"Failed to decode tile data.\n");
              iVar10 = iVar20;
            }
          }
          pEVar11 = exr_image->tiles;
          (&pEVar11->offset_x)[lVar25] = iVar19;
          (&pEVar11->offset_y)[lVar25] = iVar3;
          *(undefined8 *)(&pEVar11->level_x + lVar25) = 0;
          lVar25 = lVar25 + 8;
        }
        if (iVar10 != 0) goto LAB_0016267b;
        exr_image->num_tiles = (int)__size;
LAB_0016261d:
        for (lVar25 = 0; lVar25 < exr_header->num_channels; lVar25 = lVar25 + 1) {
          exr_header->pixel_types[lVar25] = exr_header->requested_pixel_types[lVar25];
        }
        exr_image->num_channels = num_channels;
        exr_image->width = iVar1;
        exr_image->height = iVar2;
        iVar10 = 0;
        goto LAB_0016267b;
      }
      iVar10 = -9;
      if ((EXRChannelInfo *)err == (EXRChannelInfo *)0x0) goto LAB_0016267b;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar13 = std::operator<<(local_1a8,"Invalid tile size y : ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,exr_header->tile_size_y);
      std::operator<<(poVar13,"\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)err);
    }
LAB_001625cb:
    std::__cxx11::string::~string(local_230);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
LAB_0016267b:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  return iVar10;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<tinyexr::tinyexr_uint64> &offsets,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;

#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param,
                                 exr_header->custom_attributes,
                                 int(exr_header->num_custom_attributes), err)) {
      return TINYEXR_ERROR_INVALID_HEADER;
    }
#endif
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_y < exr_header->data_window.min_y) {
    if (err) {
      (*err) += "Invalid data window.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    const int threshold = 1024 * 8192;  // heuristics
    if ((data_width > threshold) || (data_height > threshold)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
  }

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  bool invalid_data = false;  // TODO(LTE): Use atomic lock for MT safety.

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        calloc(sizeof(EXRTile), static_cast<size_t>(num_tiles)));

    int err_code = TINYEXR_SUCCESS;

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)

    std::vector<std::thread> workers;
    std::atomic<size_t> tile_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_tiles)) {
      num_threads = int(num_tiles);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        size_t tile_idx = 0;
        while ((tile_idx = tile_count++) < num_tiles) {

#else
    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
#endif
          // Allocate memory for each tile.
          exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
              num_channels, exr_header->channels,
              exr_header->requested_pixel_types, exr_header->tile_size_x,
              exr_header->tile_size_y);

          // 16 byte: tile coordinates
          // 4 byte : data size
          // ~      : data(uncompressed or compressed)
          if (offsets[tile_idx] + sizeof(int) * 5 > size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data size.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          size_t data_size =
              size_t(size - (offsets[tile_idx] + sizeof(int) * 5));
          const unsigned char *data_ptr =
              reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

          int tile_coordinates[4];
          memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
          tinyexr::swap4(&tile_coordinates[0]);
          tinyexr::swap4(&tile_coordinates[1]);
          tinyexr::swap4(&tile_coordinates[2]);
          tinyexr::swap4(&tile_coordinates[3]);

          // @todo{ LoD }
          if (tile_coordinates[2] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }
          if (tile_coordinates[3] != 0) {
            err_code = TINYEXR_ERROR_UNSUPPORTED_FEATURE;
            break;
          }

          int data_len;
          memcpy(&data_len, data_ptr + 16,
                 sizeof(int));  // 16 = sizeof(tile_coordinates)
          tinyexr::swap4(&data_len);

          if (data_len < 4 || size_t(data_len) > data_size) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Insufficient data length.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
            break;
          }

          // Move to data addr: 20 = 16 + 4;
          data_ptr += 20;

          bool ret = tinyexr::DecodeTiledPixelData(
              exr_image->tiles[tile_idx].images,
              &(exr_image->tiles[tile_idx].width),
              &(exr_image->tiles[tile_idx].height),
              exr_header->requested_pixel_types, data_ptr,
              static_cast<size_t>(data_len), exr_header->compression_type,
              exr_header->line_order, data_width, data_height,
              tile_coordinates[0], tile_coordinates[1], exr_header->tile_size_x,
              exr_header->tile_size_y, static_cast<size_t>(pixel_data_size),
              static_cast<size_t>(exr_header->num_custom_attributes),
              exr_header->custom_attributes,
              static_cast<size_t>(exr_header->num_channels),
              exr_header->channels, channel_offset_list);

          if (!ret) {
            // TODO(LTE): atomic
            if (err) {
              (*err) += "Failed to decode tile data.\n";
            }
            err_code = TINYEXR_ERROR_INVALID_DATA;
          }

          exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
          exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
          exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
          exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }  // num_thread loop

    for (auto &t : workers) {
      t.join();
    }

#else
    }
#endif

    if (err_code != TINYEXR_SUCCESS) {
      return err_code;
    }

    exr_image->num_tiles = static_cast<int>(num_tiles);
  } else {  // scanline format

    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(&line_no);
            tinyexr::swap4(&data_len);

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window.max_y + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window.min_y);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window.min_y;
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if (__cplusplus > 199711L) && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      std::stringstream ss;
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}